

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O3

void __thiscall
kj::Exception::setDetail(Exception *this,DetailTypeId typeId,Array<unsigned_char> *value)

{
  RemoveConst<kj::Exception::Detail> *pRVar1;
  uchar *puVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  RemoveConst<kj::Exception::Detail> *pRVar5;
  size_t newSize;
  Detail *pDVar6;
  
  pDVar6 = (this->details).builder.ptr;
  while( true ) {
    if (pDVar6 == (this->details).builder.pos) {
      puVar2 = value->ptr;
      sVar3 = value->size_;
      pAVar4 = value->disposer;
      value->ptr = (uchar *)0x0;
      value->size_ = 0;
      pRVar5 = (this->details).builder.pos;
      if (pRVar5 == (this->details).builder.endPtr) {
        pRVar1 = (this->details).builder.ptr;
        newSize = 4;
        if (pRVar5 != pRVar1) {
          newSize = (long)pRVar5 - (long)pRVar1 >> 4;
        }
        Vector<kj::Exception::Detail>::setCapacity(&this->details,newSize);
        pRVar5 = (this->details).builder.pos;
      }
      pRVar5->id = typeId;
      (pRVar5->value).ptr = puVar2;
      (pRVar5->value).size_ = sVar3;
      (pRVar5->value).disposer = pAVar4;
      (this->details).builder.pos = pRVar5 + 1;
      return;
    }
    if (pDVar6->id == typeId) break;
    pDVar6 = pDVar6 + 1;
  }
  puVar2 = (pDVar6->value).ptr;
  if (puVar2 != (uchar *)0x0) {
    sVar3 = (pDVar6->value).size_;
    (pDVar6->value).ptr = (uchar *)0x0;
    (pDVar6->value).size_ = 0;
    pAVar4 = (pDVar6->value).disposer;
    (**pAVar4->_vptr_ArrayDisposer)(pAVar4,puVar2,1,sVar3,sVar3,0);
  }
  (pDVar6->value).ptr = value->ptr;
  (pDVar6->value).size_ = value->size_;
  (pDVar6->value).disposer = value->disposer;
  value->ptr = (uchar *)0x0;
  value->size_ = 0;
  return;
}

Assistant:

void Exception::setDetail(DetailTypeId typeId, kj::Array<byte> value) {
  for (auto& detail: details) {
    if (detail.id == typeId) {
      detail.value = kj::mv(value);
      return;
    }
  }
  details.add(Detail {
    .id = typeId,
    .value = kj::mv(value),
  });
}